

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O3

int enet_protocol_send_outgoing_commands(ENetHost *host,ENetEvent *event,int checkForTimeouts)

{
  byte *pbVar1;
  ENetBuffer *buffers;
  ENetList *pEVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  short sVar6;
  short sVar7;
  undefined2 uVar8;
  enet_uint32 eVar9;
  uint uVar10;
  enet_uint32 eVar11;
  ENetPeer *peer;
  _func_size_t_void_ptr_ENetBuffer_ptr_size_t_size_t_enet_uint8_ptr_size_t *p_Var12;
  ENetChecksumCallback p_Var13;
  size_t sVar14;
  undefined4 uVar15;
  ENetProtocolCommandHeader EVar16;
  undefined4 uVar17;
  ENetProtocolAcknowledge EVar18;
  ENetProtocolAcknowledge EVar19;
  ENetEvent *pEVar20;
  ushort uVar21;
  int iVar22;
  void *pvVar23;
  ENetProtocolAcknowledge *pEVar24;
  size_t sVar25;
  uint uVar26;
  ENetBuffer *pEVar27;
  uint uVar28;
  _ENetListNode *p_Var29;
  ENetListIterator pEVar30;
  enet_uint32 eVar31;
  ENetPacket *pEVar32;
  uint uVar33;
  ulong uVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  _ENetListNode *p_Var39;
  enet_uint8 headerData [10];
  uint local_6c;
  ushort local_68;
  ENetEvent *local_60;
  enet_uint8 (*local_58) [4096];
  ENetBuffer *local_50;
  ENetProtocol *local_48;
  _ENetListNode *local_40;
  ENetListIterator local_38;
  
  local_48 = host->commands;
  buffers = host->buffers;
  local_50 = host->buffers + 1;
  local_58 = host->packetData + 1;
  uVar38 = host->peerCount;
  local_60 = event;
  do {
    host->continueSending = 0;
    if (uVar38 == 0) {
      return 0;
    }
    uVar37 = 0;
    do {
      peer = host->peer_list[uVar37];
      if ((peer->state != ENET_PEER_STATE_DISCONNECTED) && (peer->state != ENET_PEER_STATE_ZOMBIE))
      {
        host->headerFlags = 0;
        host->commandCount = 0;
        host->bufferCount = 1;
        host->packetSize = 6;
        p_Var29 = (peer->acknowledgements).sentinel.next;
        if (p_Var29 != &(peer->acknowledgements).sentinel) {
          lVar35 = 0x6c8;
          uVar38 = 0x6c;
          do {
            if (0x6ab < uVar38) {
              lVar35 = 0x8c8;
              uVar38 = 0x6ac;
LAB_00105271:
              host->continueSending = 1;
              break;
            }
            sVar25 = host->packetSize;
            if (peer->mtu - sVar25 < 8) goto LAB_00105271;
            p_Var39 = p_Var29->next;
            *(ulong *)((long)host->commands + lVar35 + -0x6c) =
                 (long)host->commands + (uVar38 - 0x6c);
            *(undefined8 *)((long)host->commands + lVar35 + -100) = 8;
            host->packetSize = sVar25 + 8;
            uVar21 = *(ushort *)((long)&p_Var29[1].next + 6);
            uVar21 = uVar21 << 8 | uVar21 >> 8;
            *(undefined1 *)((long)host->commands + (uVar38 - 0x6c)) = 1;
            *(undefined1 *)((long)host->commands + (uVar38 - 0x6b)) =
                 *(undefined1 *)((long)&p_Var29[1].next + 5);
            *(ushort *)((long)host->commands + (uVar38 - 0x6a)) = uVar21;
            *(ushort *)((long)host->commands + (uVar38 - 0x68)) = uVar21;
            *(ushort *)((long)host->commands + (uVar38 - 0x66)) =
                 *(ushort *)&p_Var29[1].next << 8 | *(ushort *)&p_Var29[1].next >> 8;
            if (((ulong)p_Var29[1].next & 0xf00000000) == 0x400000000) {
              enet_protocol_dispatch_state(host,peer,ENET_PEER_STATE_ZOMBIE);
            }
            enet_list_remove(p_Var29);
            enet_free(p_Var29);
            uVar38 = uVar38 + 0x32;
            lVar35 = lVar35 + 0x10;
            p_Var29 = p_Var39;
          } while (p_Var39 != &(peer->acknowledgements).sentinel);
          host->commandCount = (long)(short)(((short)((short)uVar38 + -0x6c) >> 1) * 0x5c29);
          host->bufferCount = lVar35 + -0x6b8 >> 4;
        }
        if (checkForTimeouts != 0) {
          pEVar2 = &peer->sentReliableCommands;
          p_Var29 = (peer->sentReliableCommands).sentinel.next;
          if ((p_Var29 != &pEVar2->sentinel) && (host->serviceTime - peer->nextTimeout < 86400000))
          {
            pEVar30 = (peer->outgoingReliableCommands).sentinel.next;
            do {
              pEVar20 = local_60;
              p_Var39 = p_Var29->next;
              eVar31 = host->serviceTime;
              eVar9 = *(enet_uint32 *)((long)&p_Var29[1].next + 4);
              uVar28 = eVar31 - eVar9;
              uVar26 = eVar9 - eVar31;
              uVar33 = uVar28;
              if (86399999 < uVar28) {
                uVar33 = uVar26;
              }
              uVar10 = *(uint *)&p_Var29[1].previous;
              if (uVar10 <= uVar33) {
                eVar11 = peer->earliestTimeout;
                if ((eVar11 == 0) || (86399999 < eVar9 - eVar11)) {
                  peer->earliestTimeout = eVar9;
                  if (eVar9 != 0) goto LAB_00105342;
                }
                else {
                  uVar28 = eVar31 - eVar11;
                  uVar26 = eVar11 - eVar31;
LAB_00105342:
                  if (uVar28 < 86400000) {
                    uVar26 = uVar28;
                  }
                  if ((peer->timeoutMaximum <= uVar26) ||
                     ((*(uint *)((long)&p_Var29[1].previous + 4) <= uVar10 &&
                      (peer->timeoutMinimum <= uVar26)))) {
                    enet_protocol_notify_disconnect(host,peer,local_60);
                    if ((pEVar20 != (ENetEvent *)0x0) && (local_60->type != ENET_EVENT_TYPE_NONE)) {
                      return 1;
                    }
                    goto LAB_0010594a;
                  }
                }
                if (p_Var29[6].next != (_ENetListNode *)0x0) {
                  peer->reliableDataInTransit =
                       peer->reliableDataInTransit - (uint)*(ushort *)((long)&p_Var29[2].next + 4);
                }
                peer->packetsLost = peer->packetsLost + 1;
                *(uint *)&p_Var29[1].previous = uVar10 * 2;
                pvVar23 = enet_list_remove(p_Var29);
                enet_list_insert(pEVar30,pvVar23);
                p_Var29 = (peer->sentReliableCommands).sentinel.next;
                if (p_Var29 != &pEVar2->sentinel && p_Var39 == p_Var29) {
                  peer->nextTimeout =
                       *(int *)&p_Var39[1].previous + *(int *)((long)&p_Var39[1].next + 4);
                }
              }
              p_Var29 = p_Var39;
            } while (p_Var39 != &pEVar2->sentinel);
          }
        }
        if ((((peer->outgoingReliableCommands).sentinel.next ==
              &(peer->outgoingReliableCommands).sentinel) ||
            (iVar22 = enet_protocol_send_reliable_outgoing_commands(host,peer), iVar22 != 0)) &&
           ((peer->sentReliableCommands).sentinel.next == &(peer->sentReliableCommands).sentinel)) {
          uVar26 = host->serviceTime - peer->lastReceiveTime;
          uVar33 = peer->lastReceiveTime - host->serviceTime;
          if (uVar26 < 86400000) {
            uVar33 = uVar26;
          }
          if ((peer->pingInterval <= uVar33) && (3 < (ulong)peer->mtu - host->packetSize)) {
            enet_peer_ping(peer);
            enet_protocol_send_reliable_outgoing_commands(host,peer);
          }
        }
        pEVar2 = &peer->outgoingUnreliableCommands;
        p_Var29 = (peer->outgoingUnreliableCommands).sentinel.next;
        sVar25 = host->commandCount;
        if (p_Var29 != &pEVar2->sentinel) {
          pEVar27 = host->buffers + host->bufferCount;
          lVar36 = host->bufferCount * 0x10 + 0x6b8;
          pEVar24 = (ENetProtocolAcknowledge *)(host->commands + sVar25);
          lVar35 = sVar25 * 0x32 + 0x6c;
          local_38 = &(peer->sentUnreliableCommands).sentinel;
          local_40 = &(peer->outgoingReliableCommands).sentinel;
          do {
            if ((0x6ab < lVar35) || (0xab7 < lVar36)) {
LAB_00105635:
              host->continueSending = 1;
              pEVar27 = (ENetBuffer *)((long)host->commands + lVar36 + -0x6c);
              pEVar24 = (ENetProtocolAcknowledge *)((long)host->commands + lVar35 + -0x6c);
              break;
            }
            uVar38 = commandSizes[*(byte *)&p_Var29[2].previous & 0xf];
            sVar25 = host->packetSize;
            uVar34 = peer->mtu - sVar25;
            if (uVar34 < uVar38) goto LAB_00105635;
            pEVar32 = (ENetPacket *)p_Var29[6].next;
            if (pEVar32 == (ENetPacket *)0x0) {
              p_Var39 = p_Var29->next;
LAB_00105592:
              pEVar27->data = pEVar24;
              pEVar27->dataLength = uVar38;
              host->packetSize = sVar25 + uVar38;
              uVar8 = *(undefined2 *)&p_Var29[5].previous;
              pEVar24[6].header.command = (char)uVar8;
              pEVar24[6].header.channelID = (char)((ushort)uVar8 >> 8);
              EVar18 = (ENetProtocolAcknowledge)p_Var29[2].previous;
              EVar19 = (ENetProtocolAcknowledge)p_Var29[3].next;
              auVar5 = *(undefined1 (*) [16])&p_Var29[3].previous;
              uVar15 = *(undefined4 *)((long)&p_Var29[4].previous + 4);
              EVar16 = *(ENetProtocolCommandHeader *)&p_Var29[5].next;
              uVar17 = *(undefined4 *)((long)&p_Var29[5].next + 4);
              pEVar24[4].header = *(ENetProtocolCommandHeader *)&p_Var29[4].previous;
              pEVar24[4].receivedReliableSequenceNumber = (short)uVar15;
              pEVar24[4].receivedSentTime = (short)((uint)uVar15 >> 0x10);
              pEVar24[5].header = EVar16;
              pEVar24[5].receivedReliableSequenceNumber = (short)uVar17;
              pEVar24[5].receivedSentTime = (short)((uint)uVar17 >> 0x10);
              *(undefined1 (*) [16])(pEVar24 + 2) = auVar5;
              *pEVar24 = EVar18;
              pEVar24[1] = EVar19;
              enet_list_remove(p_Var29);
              if (p_Var29[6].next == (_ENetListNode *)0x0) {
                lVar36 = lVar36 + 0x10;
                enet_free(p_Var29);
              }
              else {
                *(ulong *)((long)host->commands + lVar36 + -0x5c) =
                     (long)&(p_Var29[6].next[1].next)->next + (ulong)*(uint *)&p_Var29[2].next;
                uVar38 = (ulong)*(ushort *)((long)&p_Var29[2].next + 4);
                *(ulong *)((long)host->commands + lVar36 + -0x54) = uVar38;
                host->packetSize = host->packetSize + uVar38;
                enet_list_insert(local_38,p_Var29);
                lVar36 = lVar36 + 0x20;
              }
              lVar35 = lVar35 + 0x32;
              p_Var29 = p_Var39;
            }
            else {
              if (uVar34 < *(ushort *)((long)&p_Var29[2].next + 4) + uVar38) goto LAB_00105635;
              p_Var39 = p_Var29->next;
              if ((*(int *)&p_Var29[2].next != 0) ||
                 (uVar33 = peer->packetThrottleCounter + 7 & 0x1f,
                 peer->packetThrottleCounter = uVar33, uVar33 <= peer->packetThrottle))
              goto LAB_00105592;
              sVar6 = *(short *)&p_Var29[1].next;
              sVar7 = *(short *)((long)&p_Var29[1].next + 2);
              pEVar30 = p_Var29;
              p_Var29 = p_Var39;
              while( true ) {
                pEVar32->referenceCount = pEVar32->referenceCount - 1;
                if (pEVar32->referenceCount == 0) {
                  enet_packet_destroy(pEVar32);
                }
                enet_list_remove(pEVar30);
                enet_free(pEVar30);
                if (((p_Var29 == &pEVar2->sentinel) || (*(short *)&p_Var29[1].next != sVar6)) ||
                   (*(short *)((long)&p_Var29[1].next + 2) != sVar7)) break;
                pEVar32 = (ENetPacket *)p_Var29[6].next;
                pEVar30 = p_Var29;
                p_Var29 = p_Var29->next;
              }
            }
            pEVar27 = (ENetBuffer *)((long)host->commands + lVar36 + -0x6c);
            pEVar24 = (ENetProtocolAcknowledge *)((long)host->commands + lVar35 + -0x6c);
          } while (p_Var29 != &pEVar2->sentinel);
          sVar25 = ((long)pEVar24 - (long)local_48 >> 1) * -0x70a3d70a3d70a3d7;
          host->commandCount = sVar25;
          host->bufferCount = (long)pEVar27 - (long)buffers >> 4;
          if (((peer->state == ENET_PEER_STATE_DISCONNECT_LATER) &&
              (((ENetListNode *)&local_40->next)->next == local_40)) &&
             (((pEVar2->sentinel).next == &pEVar2->sentinel &&
              ((peer->sentReliableCommands).sentinel.next == &(peer->sentReliableCommands).sentinel)
              ))) {
            enet_peer_disconnect(peer,peer->eventData);
            sVar25 = host->commandCount;
          }
        }
        if (sVar25 != 0) {
          eVar31 = peer->packetLossEpoch;
          eVar9 = host->serviceTime;
          if (eVar31 == 0) {
            peer->packetLossEpoch = eVar9;
          }
          else {
            uVar33 = eVar31 - eVar9;
            if (eVar9 - eVar31 < 86400000) {
              uVar33 = eVar9 - eVar31;
            }
            if ((9999 < uVar33) && (peer->packetsSent != 0)) {
              uVar33 = peer->packetLoss;
              uVar26 = (peer->packetsLost << 0x10) / peer->packetsSent;
              if (uVar26 < uVar33) {
                eVar31 = uVar33 - (uVar33 - uVar26 >> 3);
                uVar26 = eVar31 - uVar26;
              }
              else {
                eVar31 = (uVar26 - uVar33 >> 3) + uVar33;
                uVar26 = uVar26 - eVar31;
              }
              peer->packetLoss = eVar31;
              peer->packetLossVariance =
                   (uVar26 >> 2) + (peer->packetLossVariance - (peer->packetLossVariance >> 2));
              peer->packetLossEpoch = eVar9;
              peer->packetsSent = 0;
              peer->packetsLost = 0;
            }
          }
          host->buffers[0].data = &local_6c;
          uVar33 = host->headerFlags;
          sVar25 = 4;
          if ((uVar33 >> 0x1b & 1) != 0) {
            local_68 = (ushort)eVar9 << 8 | (ushort)eVar9 >> 8;
            sVar25 = 6;
          }
          host->buffers[0].dataLength = sVar25;
          pvVar23 = (host->compressor).context;
          if ((pvVar23 == (void *)0x0) ||
             (p_Var12 = (host->compressor).compress,
             p_Var12 ==
             (_func_size_t_void_ptr_ENetBuffer_ptr_size_t_size_t_enet_uint8_ptr_size_t *)0x0)) {
LAB_00105829:
            sVar25 = 0;
          }
          else {
            uVar38 = host->packetSize - 6;
            sVar25 = (*p_Var12)(pvVar23,local_50,host->bufferCount - 1,uVar38,*local_58,uVar38);
            uVar33 = host->headerFlags;
            if (uVar38 <= sVar25 || sVar25 == 0) goto LAB_00105829;
            uVar33 = uVar33 | 0x4000000;
            host->headerFlags = uVar33;
          }
          uVar26 = peer->outgoingPeerID;
          if (uVar26 < 0xffffff) {
            iVar22._0_1_ = peer->outgoingSessionID;
            iVar22._1_1_ = peer->incomingSessionID;
            iVar22._2_2_ = *(undefined2 *)&peer->field_0x26;
            uVar33 = uVar33 | iVar22 << 0x18;
            host->headerFlags = uVar33;
          }
          uVar33 = uVar33 | uVar26;
          local_6c = uVar33 >> 0x18 | (uVar33 & 0xff0000) >> 8 | (uVar33 & 0xff00) << 8 |
                     uVar33 << 0x18;
          p_Var13 = host->checksum;
          if (p_Var13 != (ENetChecksumCallback)0x0) {
            eVar31 = 0;
            if (uVar26 < 0xffffff) {
              eVar31 = peer->connectID;
            }
            sVar14 = host->buffers[0].dataLength;
            *(enet_uint32 *)((long)&local_6c + sVar14) = eVar31;
            host->buffers[0].dataLength = sVar14 + 4;
            eVar31 = (*p_Var13)(buffers,host->bufferCount);
            *(enet_uint32 *)((long)&local_6c + sVar14) = eVar31;
          }
          if (sVar25 == 0) {
            sVar25 = host->bufferCount;
          }
          else {
            host->buffers[1].data = local_58;
            host->buffers[1].dataLength = sVar25;
            host->bufferCount = 2;
            sVar25 = 2;
          }
          peer->lastSendTime = host->serviceTime;
          iVar22 = enet_socket_send(host->socket,&peer->address,buffers,sVar25);
          p_Var29 = (peer->sentUnreliableCommands).sentinel.next;
          while (p_Var29 != &(peer->sentUnreliableCommands).sentinel) {
            enet_list_remove(p_Var29);
            pEVar32 = (ENetPacket *)p_Var29[6].next;
            if ((pEVar32 != (ENetPacket *)0x0) &&
               (pEVar32->referenceCount = pEVar32->referenceCount - 1, pEVar32->referenceCount == 0)
               ) {
              pbVar1 = (byte *)((long)&pEVar32->flags + 1);
              *pbVar1 = *pbVar1 | 1;
              enet_packet_destroy(pEVar32);
            }
            enet_free(p_Var29);
            p_Var29 = (peer->sentUnreliableCommands).sentinel.next;
          }
          if (iVar22 < 0) {
            return -1;
          }
          uVar3 = host->totalSentData;
          uVar4 = host->totalSentPackets;
          host->totalSentData = iVar22 + uVar3;
          host->totalSentPackets = uVar4 + 1;
        }
      }
LAB_0010594a:
      uVar37 = uVar37 + 1;
      uVar38 = host->peerCount;
    } while (uVar37 < uVar38);
    if (host->continueSending == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
enet_protocol_send_outgoing_commands (ENetHost * host, ENetEvent * event, int checkForTimeouts)
{
    enet_uint8 headerData [sizeof (ENetProtocolHeader) + sizeof (enet_uint32)];
    ENetProtocolHeader * header = (ENetProtocolHeader *) headerData;
    ENetPeer * currentPeer;
    int sentLength;
    size_t shouldCompress = 0;
    int i;

    host -> continueSending = 1;

    while (host -> continueSending)
    for (host -> continueSending = 0,
	     i = 0; i < host -> peerCount; i++ )
    {
	currentPeer = host -> peer_list[i];
        if (currentPeer -> state == ENET_PEER_STATE_DISCONNECTED ||
            currentPeer -> state == ENET_PEER_STATE_ZOMBIE)
          continue;

        host -> headerFlags = 0;
        host -> commandCount = 0;
        host -> bufferCount = 1;
        host -> packetSize = sizeof (ENetProtocolHeader);

        if (! enet_list_empty (& currentPeer -> acknowledgements))
          enet_protocol_send_acknowledgements (host, currentPeer);

        if (checkForTimeouts != 0 &&
            ! enet_list_empty (& currentPeer -> sentReliableCommands) &&
            ENET_TIME_GREATER_EQUAL (host -> serviceTime, currentPeer -> nextTimeout) &&
            enet_protocol_check_timeouts (host, currentPeer, event) == 1)
        {
            if (event != NULL && event -> type != ENET_EVENT_TYPE_NONE)
              return 1;
            else
              continue;
        }

        if ((enet_list_empty (& currentPeer -> outgoingReliableCommands) ||
              enet_protocol_send_reliable_outgoing_commands (host, currentPeer)) &&
            enet_list_empty (& currentPeer -> sentReliableCommands) &&
            ENET_TIME_DIFFERENCE (host -> serviceTime, currentPeer -> lastReceiveTime) >= currentPeer -> pingInterval &&
            currentPeer -> mtu - host -> packetSize >= sizeof (ENetProtocolPing))
        { 
            enet_peer_ping (currentPeer);
            enet_protocol_send_reliable_outgoing_commands (host, currentPeer);
        }
                      
        if (! enet_list_empty (& currentPeer -> outgoingUnreliableCommands))
          enet_protocol_send_unreliable_outgoing_commands (host, currentPeer);

        if (host -> commandCount == 0)
          continue;

        if (currentPeer -> packetLossEpoch == 0)
          currentPeer -> packetLossEpoch = host -> serviceTime;
        else
        if (ENET_TIME_DIFFERENCE (host -> serviceTime, currentPeer -> packetLossEpoch) >= ENET_PEER_PACKET_LOSS_INTERVAL &&
            currentPeer -> packetsSent > 0)
        {
           enet_uint32 packetLoss = currentPeer -> packetsLost * ENET_PEER_PACKET_LOSS_SCALE / currentPeer -> packetsSent;

#ifdef ENET_DEBUG
           printf ("peer %u: %f%%+-%f%% packet loss, %u+-%u ms round trip time, %f%% throttle, %u/%u outgoing, %u/%u incoming\n", currentPeer -> incomingPeerID, currentPeer -> packetLoss / (float) ENET_PEER_PACKET_LOSS_SCALE, currentPeer -> packetLossVariance / (float) ENET_PEER_PACKET_LOSS_SCALE, currentPeer -> roundTripTime, currentPeer -> roundTripTimeVariance, currentPeer -> packetThrottle / (float) ENET_PEER_PACKET_THROTTLE_SCALE, enet_list_size (& currentPeer -> outgoingReliableCommands), enet_list_size (& currentPeer -> outgoingUnreliableCommands), currentPeer -> channels != NULL ? enet_list_size (& currentPeer -> channels -> incomingReliableCommands) : 0, currentPeer -> channels != NULL ? enet_list_size (& currentPeer -> channels -> incomingUnreliableCommands) : 0);
#endif
          
           currentPeer -> packetLossVariance -= currentPeer -> packetLossVariance / 4;

           if (packetLoss >= currentPeer -> packetLoss)
           {
              currentPeer -> packetLoss += (packetLoss - currentPeer -> packetLoss) / 8;
              currentPeer -> packetLossVariance += (packetLoss - currentPeer -> packetLoss) / 4;
           }
           else
           {
              currentPeer -> packetLoss -= (currentPeer -> packetLoss - packetLoss) / 8;
              currentPeer -> packetLossVariance += (currentPeer -> packetLoss - packetLoss) / 4;
           }

           currentPeer -> packetLossEpoch = host -> serviceTime;
           currentPeer -> packetsSent = 0;
           currentPeer -> packetsLost = 0;
        }

        host -> buffers -> data = headerData;
        if (host -> headerFlags & ENET_PROTOCOL_HEADER_FLAG_SENT_TIME)
        {
            header -> sentTime = ENET_HOST_TO_NET_16 (host -> serviceTime & 0xFFFF);

            host -> buffers -> dataLength = sizeof (ENetProtocolHeader);
        }
        else
          host -> buffers -> dataLength = (size_t) & ((ENetProtocolHeader *) 0) -> sentTime;

        shouldCompress = 0;
        if (host -> compressor.context != NULL && host -> compressor.compress != NULL)
        {
            size_t originalSize = host -> packetSize - sizeof(ENetProtocolHeader),
                   compressedSize = host -> compressor.compress (host -> compressor.context,
                                        & host -> buffers [1], host -> bufferCount - 1,
                                        originalSize,
                                        host -> packetData [1],
                                        originalSize);
            if (compressedSize > 0 && compressedSize < originalSize)
            {
                host -> headerFlags |= ENET_PROTOCOL_HEADER_FLAG_COMPRESSED;
                shouldCompress = compressedSize;
#ifdef ENET_DEBUG_COMPRESS
                printf ("peer %u: compressed %u -> %u (%u%%)\n", currentPeer -> incomingPeerID, originalSize, compressedSize, (compressedSize * 100) / originalSize);
#endif
            }
        }

        if (currentPeer -> outgoingPeerID < ENET_PROTOCOL_MAXIMUM_PEER_ID)
          host -> headerFlags |= currentPeer -> outgoingSessionID << ENET_PROTOCOL_HEADER_SESSION_SHIFT;
        header -> peerID = ENET_HOST_TO_NET_32 (currentPeer -> outgoingPeerID | host -> headerFlags);
        if (host -> checksum != NULL)
        {
            enet_uint32 * checksum = (enet_uint32 *) & headerData [host -> buffers -> dataLength];
            * checksum = currentPeer -> outgoingPeerID < ENET_PROTOCOL_MAXIMUM_PEER_ID ? currentPeer -> connectID : 0;
            host -> buffers -> dataLength += sizeof (enet_uint32);
            * checksum = host -> checksum (host -> buffers, host -> bufferCount);
        }

        if (shouldCompress > 0)
        {
            host -> buffers [1].data = host -> packetData [1];
            host -> buffers [1].dataLength = shouldCompress;
            host -> bufferCount = 2;
        }

        currentPeer -> lastSendTime = host -> serviceTime;

        sentLength = enet_socket_send (host -> socket, & currentPeer -> address, host -> buffers, host -> bufferCount);

        enet_protocol_remove_sent_unreliable_commands (currentPeer);

        if (sentLength < 0)
          return -1;

        host -> totalSentData += sentLength;
        host -> totalSentPackets ++;
    }
   
    return 0;
}